

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_heap.c
# Opt level: O3

void adt_heap_sortDown(adt_ary_t *heap,int32_t parentIndex,adt_heap_family heapFamily)

{
  int s32Index;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  int32_t iVar6;
  void **ppvVar7;
  void **ppvVar8;
  void **ppvVar9;
  void *tmp;
  bool bVar10;
  uint local_4c;
  
  if (-1 < parentIndex && heap != (adt_ary_t *)0x0) {
    while (iVar6 = adt_ary_length(heap), parentIndex < iVar6) {
      ppvVar7 = adt_ary_get(heap,parentIndex);
      if (ppvVar7 == (void **)0x0) {
        __assert_fail("ppParent != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                      ,0x7c,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
      }
      pvVar3 = *ppvVar7;
      s32Index = parentIndex * 2 + 2;
      parentIndex = parentIndex * 2 + 1;
      if (parentIndex < iVar6) {
        ppvVar8 = adt_ary_get(heap,parentIndex);
        if (ppvVar8 == (void **)0x0) {
          __assert_fail("ppLeft != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                        ,0x84,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
        }
        local_4c = *(uint *)((long)*ppvVar8 + 8);
        uVar1 = *(uint *)((long)pvVar3 + 8);
        bVar5 = local_4c >= uVar1 && local_4c != uVar1;
        if (heapFamily == ADT_MIN_HEAP) {
          bVar5 = local_4c < uVar1;
        }
        if (s32Index < iVar6) goto LAB_0012077e;
        if (!bVar5) {
          return;
        }
LAB_0012080a:
        pvVar3 = *ppvVar8;
        *ppvVar8 = *ppvVar7;
        *ppvVar7 = pvVar3;
      }
      else {
        if (iVar6 <= s32Index) {
          return;
        }
        bVar5 = false;
        ppvVar8 = (void **)0x0;
        local_4c = 0;
LAB_0012077e:
        ppvVar9 = adt_ary_get(heap,s32Index);
        if (ppvVar9 == (void **)0x0) {
          __assert_fail("ppRight != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                        ,0x96,"void adt_heap_sortDown(adt_ary_t *, int32_t, adt_heap_family)");
        }
        pvVar4 = *ppvVar9;
        uVar1 = *(uint *)((long)pvVar4 + 8);
        uVar2 = *(uint *)((long)pvVar3 + 8);
        if (heapFamily == ADT_MIN_HEAP) {
          bVar10 = uVar1 < uVar2;
          if (!(bool)(bVar5 & bVar10)) goto LAB_001207d9;
          if (uVar1 < local_4c) goto LAB_001207e8;
          goto LAB_0012080a;
        }
        bVar10 = uVar2 < uVar1;
        if ((bool)(bVar5 & bVar10)) {
          if (uVar1 <= local_4c) goto LAB_0012080a;
        }
        else {
LAB_001207d9:
          if (bVar5) goto LAB_0012080a;
          if (!bVar10) {
            return;
          }
        }
LAB_001207e8:
        *ppvVar9 = *ppvVar7;
        *ppvVar7 = pvVar4;
        parentIndex = s32Index;
      }
      if (iVar6 <= parentIndex * 2 + 1) {
        return;
      }
      if (parentIndex < 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void adt_heap_sortDown(adt_ary_t *heap, int32_t parentIndex, adt_heap_family heapFamily){
   if ( (heap != 0) && (parentIndex>=0) ){
      int32_t curLen = adt_ary_length(heap);
      if (parentIndex < curLen ){
         bool swapLeft = false, swapRight = false;
         void **ppLeft = 0, **ppRight = 0, **ppParent;
         adt_heap_elem_t *pParentElem;
         int32_t leftChildIndex, rightChildIndex;
         uint32_t leftChildValue = 0;

         ppParent = adt_ary_get(heap, parentIndex);
         assert(ppParent != 0);
         pParentElem = *ppParent;
         //children indices at 2i+1, 2i+2
         leftChildIndex = (parentIndex<<1) + 1;
         rightChildIndex = leftChildIndex + 1;
         if(leftChildIndex < curLen){
            adt_heap_elem_t *pLeftElem;
            ppLeft = adt_ary_get(heap, leftChildIndex);
            assert(ppLeft != 0);
            pLeftElem = *ppLeft;
            leftChildValue = pLeftElem->u32Value;
            if (heapFamily == ADT_MIN_HEAP){
               if (leftChildValue < pParentElem->u32Value){
                  swapLeft = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (leftChildValue > pParentElem->u32Value){
                  swapLeft = true;
               }
            }
         }
         if( rightChildIndex < curLen ){
            adt_heap_elem_t *pRightElem;
            ppRight = adt_ary_get(heap, rightChildIndex);
            assert(ppRight != 0);
            pRightElem = *ppRight;
            if (heapFamily == ADT_MIN_HEAP){
               if (pRightElem->u32Value < pParentElem->u32Value){
                  swapRight = true;
               }
            }
            else {
               //implicit ADT_MAX_HEAP
               if (pRightElem->u32Value > pParentElem->u32Value){
                  swapRight = true;
               }
            }
            if ( (swapLeft == true) && (swapRight == true) ){
               //compare which of the two children has the lowest priority
               if (heapFamily == ADT_MIN_HEAP){
                  if (pRightElem->u32Value < leftChildValue){
                     swapLeft = false;
                  }
               }
               else {
                  //implicit ADT_MAX_HEAP
                  if (pRightElem->u32Value > leftChildValue){
                     swapLeft = false;
                  }
               }
            }
         }
         if (swapLeft == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppLeft;
            *ppLeft = *ppParent;
            *ppParent = tmp;

            //call recursively on left child (trickle down)
            if ( ( (leftChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, leftChildIndex, heapFamily);
            }
         }
         else if (swapRight == true){
            //swap parent and left child
            void *tmp;
            tmp = *ppRight;
            *ppRight = *ppParent;
            *ppParent = tmp;

            //call recursively on right child (trickle down)
            if ( ( (rightChildIndex<<1) + 1) < curLen) {
               adt_heap_sortDown(heap, rightChildIndex, heapFamily);
            }
         }
         else{
            //do nothing
         }
      }
   }
}